

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_key.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  mbedtls_pk_type_t mVar3;
  mbedtls_ecp_curve_info *pmVar4;
  char *pcVar5;
  mbedtls_pk_info_t *info;
  size_t __n;
  FILE *__s;
  size_t sVar6;
  mbedtls_mpi *X;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  char *__s1;
  char **ppcVar10;
  uchar *buf_00;
  mbedtls_pk_context key;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi E;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi N;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  char buf [1024];
  uchar local_3eb8 [16000];
  uchar auStack_38 [8];
  
  mbedtls_mpi_init(&N);
  mbedtls_mpi_init(&P);
  mbedtls_mpi_init(&Q);
  mbedtls_mpi_init(&D);
  mbedtls_mpi_init(&E);
  mbedtls_mpi_init(&DP);
  mbedtls_mpi_init(&DQ);
  mbedtls_mpi_init(&QP);
  mbedtls_pk_init(&key);
  mbedtls_ctr_drbg_init(&ctr_drbg);
  memset(buf,0,0x400);
  if (argc == 0) {
LAB_00109660:
    printf(
          "\n usage: gen_key param=<>...\n\n acceptable parameters:\n    type=rsa|ec           default: rsa\n    rsa_keysize=%%d        default: 4096\n    ec_curve=%%s           see below\n    filename=%%s           default: keyfile.key\n    format=pem|der        default: pem\n    use_dev_random=0|1    default: 0\n\n"
          );
    puts(" available ec_curve values:");
    pmVar4 = mbedtls_ecp_curve_list();
    printf("    %s (default)\n",pmVar4->name);
    uVar2 = 1;
    for (ppcVar10 = &pmVar4[1].name; *ppcVar10 != (char *)0x0; ppcVar10 = ppcVar10 + 2) {
      printf("    %s\n");
    }
  }
  else {
    opt.type = 1;
    opt.rsa_keysize = 0x1000;
    pmVar4 = mbedtls_ecp_curve_list();
    opt.ec_curve = pmVar4->grp_id;
    opt.filename = "keyfile.key";
    opt.format = 0;
    opt.use_dev_random = 0;
    for (lVar7 = 1; lVar7 < argc; lVar7 = lVar7 + 1) {
      pcVar9 = argv[lVar7];
      pcVar5 = strchr(pcVar9,0x3d);
      if (pcVar5 == (char *)0x0) goto LAB_00109660;
      __s1 = pcVar5 + 1;
      *pcVar5 = '\0';
      iVar1 = strcmp(pcVar9,"type");
      if (iVar1 == 0) {
        iVar1 = strcmp(__s1,"rsa");
        if (iVar1 == 0) {
          opt.type = 1;
          __s1 = opt.filename;
        }
        else {
          if (((*__s1 != 'e') || (pcVar5[2] != 'c')) || (pcVar5[3] != '\0')) goto LAB_00109660;
          opt.type = 2;
          __s1 = opt.filename;
        }
      }
      else {
        iVar1 = strcmp(pcVar9,"format");
        if (iVar1 == 0) {
          iVar1 = strcmp(__s1,"pem");
          if (iVar1 == 0) {
            opt._24_8_ = opt._24_8_ & 0xffffffff00000000;
            __s1 = opt.filename;
          }
          else {
            iVar1 = strcmp(__s1,"der");
            if (iVar1 != 0) goto LAB_00109660;
            opt.format = 1;
            __s1 = opt.filename;
          }
        }
        else {
          iVar1 = strcmp(pcVar9,"rsa_keysize");
          if (iVar1 == 0) {
            iVar1 = atoi(__s1);
            opt.rsa_keysize = iVar1;
            __s1 = opt.filename;
            if (iVar1 - 0x2001U < 0xffffe3ff) goto LAB_00109660;
          }
          else {
            iVar1 = strcmp(pcVar9,"ec_curve");
            if (iVar1 == 0) {
              pmVar4 = mbedtls_ecp_curve_info_from_name(__s1);
              if (pmVar4 == (mbedtls_ecp_curve_info *)0x0) goto LAB_00109660;
              opt.ec_curve = pmVar4->grp_id;
              __s1 = opt.filename;
            }
            else {
              iVar1 = strcmp(pcVar9,"filename");
              if (iVar1 != 0) {
                iVar1 = strcmp(pcVar9,"use_dev_random");
                if (iVar1 != 0) goto LAB_00109660;
                uVar2 = atoi(__s1);
                opt.use_dev_random = uVar2;
                __s1 = opt.filename;
                if (1 < uVar2) goto LAB_00109660;
              }
            }
          }
        }
      }
      opt.filename = __s1;
    }
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    mbedtls_entropy_init(&entropy);
    if (opt.use_dev_random == 0) {
LAB_0010973a:
      uVar2 = mbedtls_ctr_drbg_seed(&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"gen_key",7);
      if (uVar2 == 0) {
        printf("\n  . Generating the private key ...");
        fflush(_stdout);
        info = mbedtls_pk_info_from_type(opt.type);
        uVar2 = mbedtls_pk_setup(&key,info);
        if (uVar2 == 0) {
          if (opt.type == 2) {
            uVar2 = mbedtls_ecp_gen_key(opt.ec_curve,(mbedtls_ecp_keypair *)key.pk_ctx,
                                        mbedtls_ctr_drbg_random,&ctr_drbg);
            if (uVar2 == 0) {
LAB_00109909:
              puts(" ok\n  . Key information:");
              mVar3 = mbedtls_pk_get_type(&key);
              if (mVar3 == MBEDTLS_PK_RSA) {
                uVar2 = mbedtls_rsa_export((mbedtls_rsa_context *)key.pk_ctx,&N,&P,&Q,&D,&E);
                if ((uVar2 == 0) &&
                   (uVar2 = mbedtls_rsa_export_crt((mbedtls_rsa_context *)key.pk_ctx,&DP,&DQ,&QP),
                   uVar2 == 0)) {
                  mbedtls_mpi_write_file("N:  ",&N,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("E:  ",&E,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("D:  ",&D,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("P:  ",&P,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("Q:  ",&Q,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("DP: ",&DP,0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file("DQ:  ",&DQ,0x10,(FILE *)0x0);
                  pcVar9 = "QP:  ";
                  X = &QP;
LAB_00109ab4:
                  mbedtls_mpi_write_file(pcVar9,X,0x10,(FILE *)0x0);
                  goto LAB_00109abb;
                }
                pcVar9 = " failed\n  ! could not export RSA parameters\n";
              }
              else {
                mVar3 = mbedtls_pk_get_type(&key);
                if (mVar3 == MBEDTLS_PK_ECKEY) {
                  pmVar4 = mbedtls_ecp_curve_info_from_grp_id(*key.pk_ctx);
                  printf("curve: %s\n",pmVar4->name);
                  mbedtls_mpi_write_file
                            ("X_Q:   ",(mbedtls_mpi *)((long)key.pk_ctx + 0x110),0x10,(FILE *)0x0);
                  mbedtls_mpi_write_file
                            ("Y_Q:   ",(mbedtls_mpi *)((long)key.pk_ctx + 0x128),0x10,(FILE *)0x0);
                  X = (mbedtls_mpi *)((long)key.pk_ctx + 0xf8);
                  pcVar9 = "D:     ";
                  goto LAB_00109ab4;
                }
                puts("  ! key type not supported");
LAB_00109abb:
                printf("  . Writing key to file...");
                pcVar9 = opt.filename;
                memset(local_3eb8,0,16000);
                if (opt.format == 0) {
                  buf_00 = local_3eb8;
                  uVar2 = mbedtls_pk_write_key_pem(&key,buf_00,16000);
                  if (uVar2 == 0) {
                    __n = strlen((char *)buf_00);
                    goto LAB_00109b48;
                  }
                }
                else {
                  uVar2 = mbedtls_pk_write_key_der(&key,local_3eb8,16000);
                  if (-1 < (int)uVar2) {
                    __n = (size_t)uVar2;
                    buf_00 = auStack_38 + -__n;
LAB_00109b48:
                    __s = fopen(pcVar9,"wb");
                    if (__s != (FILE *)0x0) {
                      sVar6 = fwrite(buf_00,1,__n,__s);
                      fclose(__s);
                      if (sVar6 == __n) {
                        puts(" ok");
                        iVar1 = 0;
                        goto LAB_001097e7;
                      }
                    }
                    uVar2 = 0xffffffff;
                  }
                }
                pcVar9 = " failed";
              }
              puts(pcVar9);
              goto LAB_001097bc;
            }
            uVar8 = (ulong)-uVar2;
            pcVar9 = " failed\n  !  mbedtls_ecp_gen_key returned -0x%04x";
          }
          else {
            if (opt.type != 1) {
              puts(" failed\n  !  key type not supported");
              uVar2 = 0;
              goto LAB_001097bc;
            }
            uVar2 = mbedtls_rsa_gen_key((mbedtls_rsa_context *)key.pk_ctx,mbedtls_ctr_drbg_random,
                                        &ctr_drbg,opt.rsa_keysize,0x10001);
            if (uVar2 == 0) goto LAB_00109909;
            uVar8 = (ulong)-uVar2;
            pcVar9 = " failed\n  !  mbedtls_rsa_gen_key returned -0x%04x";
          }
        }
        else {
          uVar8 = (ulong)-uVar2;
          pcVar9 = " failed\n  !  mbedtls_pk_setup returned -0x%04x";
        }
      }
      else {
        uVar8 = (ulong)-uVar2;
        pcVar9 = " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n";
      }
    }
    else {
      uVar2 = mbedtls_entropy_add_source(&entropy,dev_random_entropy_poll,(void *)0x0,0x20,1);
      if (uVar2 == 0) {
        printf("\n    Using /dev/random, so can take a long time! ");
        fflush(_stdout);
        goto LAB_0010973a;
      }
      uVar8 = (ulong)-uVar2;
      pcVar9 = " failed\n  ! mbedtls_entropy_add_source returned -0x%04x\n";
    }
    printf(pcVar9,uVar8);
  }
LAB_001097bc:
  iVar1 = 1;
  mbedtls_strerror(uVar2,buf,0x400);
  printf(" - %s\n",buf);
LAB_001097e7:
  mbedtls_mpi_free(&N);
  mbedtls_mpi_free(&P);
  mbedtls_mpi_free(&Q);
  mbedtls_mpi_free(&D);
  mbedtls_mpi_free(&E);
  mbedtls_mpi_free(&DP);
  mbedtls_mpi_free(&DQ);
  mbedtls_mpi_free(&QP);
  mbedtls_pk_free(&key);
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  return iVar1;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_pk_context key;
    char buf[1024];
    int i;
    char *p, *q;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    const char *pers = "gen_key";
#if defined(MBEDTLS_ECP_C)
    const mbedtls_ecp_curve_info *curve_info;
#endif

    /*
     * Set to sane values
     */

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    mbedtls_pk_init( &key );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    memset( buf, 0, sizeof( buf ) );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
#if defined(MBEDTLS_ECP_C)
        mbedtls_printf( " available ec_curve values:\n" );
        curve_info = mbedtls_ecp_curve_list();
        mbedtls_printf( "    %s (default)\n", curve_info->name );
        while( ( ++curve_info )->name != NULL )
            mbedtls_printf( "    %s\n", curve_info->name );
#endif /* MBEDTLS_ECP_C */
        goto exit;
    }

    opt.type                = DFL_TYPE;
    opt.rsa_keysize         = DFL_RSA_KEYSIZE;
    opt.ec_curve            = DFL_EC_CURVE;
    opt.filename            = DFL_FILENAME;
    opt.format              = DFL_FORMAT;
    opt.use_dev_random      = DFL_USE_DEV_RANDOM;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "type" ) == 0 )
        {
            if( strcmp( q, "rsa" ) == 0 )
                opt.type = MBEDTLS_PK_RSA;
            else if( strcmp( q, "ec" ) == 0 )
                opt.type = MBEDTLS_PK_ECKEY;
            else
                goto usage;
        }
        else if( strcmp( p, "format" ) == 0 )
        {
            if( strcmp( q, "pem" ) == 0 )
                opt.format = FORMAT_PEM;
            else if( strcmp( q, "der" ) == 0 )
                opt.format = FORMAT_DER;
            else
                goto usage;
        }
        else if( strcmp( p, "rsa_keysize" ) == 0 )
        {
            opt.rsa_keysize = atoi( q );
            if( opt.rsa_keysize < 1024 ||
                opt.rsa_keysize > MBEDTLS_MPI_MAX_BITS )
                goto usage;
        }
#if defined(MBEDTLS_ECP_C)
        else if( strcmp( p, "ec_curve" ) == 0 )
        {
            if( ( curve_info = mbedtls_ecp_curve_info_from_name( q ) ) == NULL )
                goto usage;
            opt.ec_curve = curve_info->grp_id;
        }
#endif
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "use_dev_random" ) == 0 )
        {
            opt.use_dev_random = atoi( q );
            if( opt.use_dev_random < 0 || opt.use_dev_random > 1 )
                goto usage;
        }
        else
            goto usage;
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
#if !defined(_WIN32) && defined(MBEDTLS_FS_IO)
    if( opt.use_dev_random )
    {
        if( ( ret = mbedtls_entropy_add_source( &entropy, dev_random_entropy_poll,
                                        NULL, DEV_RANDOM_THRESHOLD,
                                        MBEDTLS_ENTROPY_SOURCE_STRONG ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_entropy_add_source returned -0x%04x\n", -ret );
            goto exit;
        }

        mbedtls_printf("\n    Using /dev/random, so can take a long time! " );
        fflush( stdout );
    }
#endif /* !_WIN32 && MBEDTLS_FS_IO */

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * 1.1. Generate the key
     */
    mbedtls_printf( "\n  . Generating the private key ..." );
    fflush( stdout );

    if( ( ret = mbedtls_pk_setup( &key,
            mbedtls_pk_info_from_type( (mbedtls_pk_type_t) opt.type ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_pk_setup returned -0x%04x", -ret );
        goto exit;
    }

#if defined(MBEDTLS_RSA_C) && defined(MBEDTLS_GENPRIME)
    if( opt.type == MBEDTLS_PK_RSA )
    {
        ret = mbedtls_rsa_gen_key( mbedtls_pk_rsa( key ), mbedtls_ctr_drbg_random, &ctr_drbg,
                                   opt.rsa_keysize, 65537 );
        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_rsa_gen_key returned -0x%04x", -ret );
            goto exit;
        }
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( opt.type == MBEDTLS_PK_ECKEY )
    {
        ret = mbedtls_ecp_gen_key( (mbedtls_ecp_group_id) opt.ec_curve,
                                   mbedtls_pk_ec( key ),
                                   mbedtls_ctr_drbg_random, &ctr_drbg );
        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_ecp_gen_key returned -0x%04x", -ret );
            goto exit;
        }
    }
    else
#endif /* MBEDTLS_ECP_C */
    {
        mbedtls_printf( " failed\n  !  key type not supported\n" );
        goto exit;
    }

    /*
     * 1.2 Print the key
     */
    mbedtls_printf( " ok\n  . Key information:\n" );

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );

        if( ( ret = mbedtls_rsa_export    ( rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
            ( ret = mbedtls_rsa_export_crt( rsa, &DP, &DQ, &QP ) )      != 0 )
        {
            mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
            goto exit;
        }

        mbedtls_mpi_write_file( "N:  ",  &N,  16, NULL );
        mbedtls_mpi_write_file( "E:  ",  &E,  16, NULL );
        mbedtls_mpi_write_file( "D:  ",  &D,  16, NULL );
        mbedtls_mpi_write_file( "P:  ",  &P,  16, NULL );
        mbedtls_mpi_write_file( "Q:  ",  &Q,  16, NULL );
        mbedtls_mpi_write_file( "DP: ",  &DP, 16, NULL );
        mbedtls_mpi_write_file( "DQ:  ", &DQ, 16, NULL );
        mbedtls_mpi_write_file( "QP:  ", &QP, 16, NULL );
    }
    else
#endif
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
        mbedtls_printf( "curve: %s\n",
                mbedtls_ecp_curve_info_from_grp_id( ecp->grp.id )->name );
        mbedtls_mpi_write_file( "X_Q:   ", &ecp->Q.X, 16, NULL );
        mbedtls_mpi_write_file( "Y_Q:   ", &ecp->Q.Y, 16, NULL );
        mbedtls_mpi_write_file( "D:     ", &ecp->d  , 16, NULL );
    }
    else
#endif
        mbedtls_printf("  ! key type not supported\n");

    /*
     * 1.3 Export key
     */
    mbedtls_printf( "  . Writing key to file..." );

    if( ( ret = write_private_key( &key, opt.filename ) ) != 0 )
    {
        mbedtls_printf( " failed\n" );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( " - %s\n", buf );
#else
        mbedtls_printf("\n");
#endif
    }

    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );

    mbedtls_pk_free( &key );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}